

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::columnResized(QTableView *this,int column,int param_2,int param_3)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QList<int>::append((QList<int> *)(lVar1 + 0x550),column);
  if (*(int *)(lVar1 + 0x548) != 0) {
    return;
  }
  QBasicTimer::start((QBasicTimer *)(lVar1 + 0x548),(Duration)0x0,(QObject *)this);
  return;
}

Assistant:

void QTableView::columnResized(int column, int, int)
{
    Q_D(QTableView);
    d->columnsToUpdate.append(column);
    if (!d->columnResizeTimer.isActive())
        d->columnResizeTimer.start(0ns, this);
}